

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamSep.h
# Opt level: O1

StreamSepMaker * __thiscall
Hpipe::StreamSepMaker::rm_beg(StreamSepMaker *__return_storage_ptr__,StreamSepMaker *this,uint n)

{
  size_type sVar1;
  char cVar2;
  char cVar3;
  string local_40;
  
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  StreamSepMaker(__return_storage_ptr__,this,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                             local_40.field_2._M_local_buf[0]) + 1);
  }
  sVar1 = (this->beg)._M_string_length;
  cVar2 = (char)sVar1;
  cVar3 = (char)n;
  if ((uint)sVar1 < n) {
    cVar3 = cVar2;
  }
  std::__cxx11::string::resize((ulong)&__return_storage_ptr__->beg,cVar2 - cVar3);
  return __return_storage_ptr__;
}

Assistant:

StreamSepMaker rm_beg( unsigned n ) {
        StreamSepMaker res = *this;
        res.beg.resize( beg.size() - std::min( unsigned( beg.size() ), n ) );
        return res;
    }